

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

bool __thiscall
flatbuffers::cpp::CppGenerator::FlexibleStringConstructor(CppGenerator *this,FieldDef *field)

{
  Value *pVVar1;
  bool bVar2;
  bool local_ab;
  byte local_aa;
  bool local_82;
  string local_80;
  byte local_5e;
  byte local_5d;
  bool ret;
  byte local_4a;
  allocator<char> local_49;
  string local_48;
  undefined1 local_21;
  FieldDef *pFStack_20;
  bool attr;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  local_4a = 0;
  local_5d = 0;
  local_82 = false;
  pFStack_20 = field;
  field_local = (FieldDef *)this;
  if (field != (FieldDef *)0x0) {
    std::allocator<char>::allocator();
    local_4a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"cpp_str_flex_ctor",&local_49);
    local_5d = 1;
    pVVar1 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(field->super_Definition).attributes,&local_48);
    local_82 = pVVar1 != (Value *)0x0;
  }
  if ((local_5d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((local_4a & 1) != 0) {
    std::allocator<char>::~allocator(&local_49);
  }
  local_21 = local_82;
  local_aa = local_21;
  if (local_82 == false) {
    local_aa = (this->opts_).super_IDLOptions.cpp_object_api_string_flexible_constructor;
  }
  local_5e = local_aa & 1;
  bVar2 = local_5e != 0;
  local_ab = false;
  if (bVar2) {
    NativeString_abi_cxx11_(&local_80,this,pFStack_20);
    local_ab = std::operator!=(&local_80,"std::string");
  }
  this_local._7_1_ = local_ab;
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FlexibleStringConstructor(const FieldDef *field) {
    auto attr = field != nullptr &&
                (field->attributes.Lookup("cpp_str_flex_ctor") != nullptr);
    auto ret = attr ? attr : opts_.cpp_object_api_string_flexible_constructor;
    return ret && NativeString(field) !=
                      "std::string";  // Only for custom string types.
  }